

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O1

void __thiscall
duckdb::PhysicalHashJoin::PhysicalHashJoin
          (PhysicalHashJoin *this,LogicalOperator *op,PhysicalOperator *left,PhysicalOperator *right
          ,vector<duckdb::JoinCondition,_true> *cond,JoinType join_type,
          vector<unsigned_long,_true> *left_projection_map,
          vector<unsigned_long,_true> *right_projection_map,
          vector<duckdb::LogicalType,_true> *delim_types,idx_t estimated_cardinality,
          unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>,_true>
          *pushdown_info_p)

{
  pointer *pprVar1;
  _Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false> _Var2;
  _Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false> __ptr;
  iterator iVar3;
  PhysicalOperator *pPVar4;
  iterator iVar5;
  size_type *psVar6;
  _func_int *p_Var7;
  _func_int **pp_Var8;
  pointer pLVar9;
  reference this_00;
  pointer pEVar10;
  BoundReferenceExpression *pBVar11;
  reference pvVar12;
  const_reference pvVar13;
  _func_int **pp_Var14;
  unsigned_long uVar15;
  _func_int *p_Var16;
  unsigned_long *__args;
  iterator iVar17;
  undefined7 in_register_00000089;
  _func_int **pp_Var18;
  unsigned_long *lhs_col;
  size_type *psVar19;
  vector<unsigned_long,_true> *__range1;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  build_columns_in_conditions;
  unsigned_long *local_d0;
  iterator local_c8;
  unsigned_long *local_c0;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  *local_b8;
  unsigned_long local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a8;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_a0;
  undefined4 local_94;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_90;
  vector<duckdb::LogicalType,_true> *local_88;
  undefined1 local_80 [56];
  vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_> local_48;
  
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_start =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
       super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (cond->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>).
  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_94 = (undefined4)CONCAT71(in_register_00000089,join_type);
  PhysicalComparisonJoin::PhysicalComparisonJoin
            (&this->super_PhysicalComparisonJoin,op,HASH_JOIN,
             (vector<duckdb::JoinCondition,_true> *)&local_48,join_type,estimated_cardinality);
  ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::~vector(&local_48);
  (this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator.
  super_PhysicalOperator._vptr_PhysicalOperator = (_func_int **)&PTR__PhysicalHashJoin_019c3718;
  local_88 = &this->condition_types;
  switchD_005700f1::default(local_88,0,0xa8);
  pLVar9 = (delim_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->delim_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (delim_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->delim_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar9;
  (this->delim_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (delim_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (delim_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (delim_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (delim_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->join_stats).
  super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->join_stats).
  super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->join_stats).
  super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Var2._M_head_impl =
       (pushdown_info_p->
       super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl;
  (pushdown_info_p->
  super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
  .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl =
       (JoinFilterPushdownInfo *)0x0;
  __ptr._M_head_impl =
       (this->super_PhysicalComparisonJoin).filter_pushdown.
       super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
       .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl;
  (this->super_PhysicalComparisonJoin).filter_pushdown.
  super_unique_ptr<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::JoinFilterPushdownInfo,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::JoinFilterPushdownInfo_*,_std::default_delete<duckdb::JoinFilterPushdownInfo>_>
  .super__Head_base<0UL,_duckdb::JoinFilterPushdownInfo_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (__ptr._M_head_impl != (JoinFilterPushdownInfo *)0x0) {
    ::std::default_delete<duckdb::JoinFilterPushdownInfo>::operator()
              ((default_delete<duckdb::JoinFilterPushdownInfo> *)
               &(this->super_PhysicalComparisonJoin).filter_pushdown,__ptr._M_head_impl);
  }
  local_90 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->payload_columns;
  local_a8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->lhs_output_columns;
  local_a0 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->rhs_output_columns;
  local_b8 = (vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                 super_CachingPhysicalOperator.super_PhysicalOperator.children;
  iVar3._M_current =
       *(pointer *)
        ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                super_CachingPhysicalOperator.super_PhysicalOperator.children.
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        + 8);
  if (iVar3._M_current ==
      *(pointer *)
       ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator
               .super_PhysicalOperator.children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       + 0x10)) {
    local_80._0_8_ = left;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              (local_b8,iVar3,(reference_wrapper<duckdb::PhysicalOperator> *)local_80);
  }
  else {
    (iVar3._M_current)->_M_data = left;
    pprVar1 = (pointer *)
              ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                      super_CachingPhysicalOperator.super_PhysicalOperator.children.
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              + 8);
    *pprVar1 = *pprVar1 + 1;
  }
  iVar3._M_current =
       *(pointer *)
        ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                super_CachingPhysicalOperator.super_PhysicalOperator.children.
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        + 8);
  if (iVar3._M_current ==
      *(pointer *)
       ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.super_CachingPhysicalOperator
               .super_PhysicalOperator.children.
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       + 0x10)) {
    local_80._0_8_ = right;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              (local_b8,iVar3,(reference_wrapper<duckdb::PhysicalOperator> *)local_80);
  }
  else {
    (iVar3._M_current)->_M_data = right;
    pprVar1 = (pointer *)
              ((long)&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                      super_CachingPhysicalOperator.super_PhysicalOperator.children.
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
              + 8);
    *pprVar1 = *pprVar1 + 1;
  }
  local_80._0_8_ = local_80 + 0x30;
  local_80._8_8_ = 1;
  local_80._16_8_ = (_Hash_node_base *)0x0;
  local_80._24_8_ = 0;
  local_80._32_4_ = 1.0;
  local_80._40_8_ = 0;
  local_80._48_8_ = (__node_base_ptr)0x0;
  local_d0 = (unsigned_long *)0x0;
  if ((this->super_PhysicalComparisonJoin).conditions.
      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->super_PhysicalComparisonJoin).conditions.
      super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      this_00 = vector<duckdb::JoinCondition,_true>::operator[]
                          (&(this->super_PhysicalComparisonJoin).conditions,(size_type)local_d0);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&this_00->left);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_88->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &pEVar10->return_type);
      pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(&this_00->right);
      if ((pEVar10->super_BaseExpression).expression_class == BOUND_REF) {
        pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(&this_00->right);
        pBVar11 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                            (&pEVar10->super_BaseExpression);
        ::std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_long&,unsigned_long&>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)local_80,&pBVar11->index,&local_d0);
      }
      local_d0 = (unsigned_long *)((long)local_d0 + 1);
    } while (local_d0 <
             (unsigned_long *)
             (((long)(this->super_PhysicalComparisonJoin).conditions.
                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_PhysicalComparisonJoin).conditions.
                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  pvVar12 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                      ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)local_b8,0)
  ;
  pPVar4 = pvVar12->_M_data;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (local_a8,&left_projection_map->
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  if ((this->lhs_output_columns).col_idxs.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->lhs_output_columns).col_idxs.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (local_a8,((long)(pPVar4->types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pPVar4->types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
              );
    local_d0 = (unsigned_long *)0x0;
    if ((pPVar4->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pPVar4->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      do {
        iVar5._M_current =
             (this->lhs_output_columns).col_idxs.
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->lhs_output_columns).col_idxs.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_a8,iVar5,
                     (unsigned_long *)&local_d0);
        }
        else {
          *iVar5._M_current = (unsigned_long)local_d0;
          (this->lhs_output_columns).col_idxs.
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_d0 = (unsigned_long *)((long)local_d0 + 1);
      } while (local_d0 <
               (unsigned_long *)
               (((long)(pPVar4->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pPVar4->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
    }
  }
  psVar19 = (this->lhs_output_columns).col_idxs.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  psVar6 = (this->lhs_output_columns).col_idxs.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar19 != psVar6) {
    do {
      pvVar13 = vector<duckdb::LogicalType,_true>::operator[](&pPVar4->types,*psVar19);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&(this->lhs_output_columns).col_types.
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,pvVar13);
      psVar19 = psVar19 + 1;
    } while (psVar19 != psVar6);
  }
  if (2 < (byte)((char)local_94 - 5U)) {
    pvVar12 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                        ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)local_b8,
                         1);
    pPVar4 = pvVar12->_M_data;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d0,
               &right_projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    if (local_d0 == local_c8._M_current) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d0,
                 ((long)(pPVar4->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pPVar4->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      local_b0 = 0;
      if ((pPVar4->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pPVar4->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          if (local_c8._M_current == local_c0) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_d0,local_c8,
                       &local_b0);
          }
          else {
            *local_c8._M_current = local_b0;
            local_c8._M_current = local_c8._M_current + 1;
          }
          local_b0 = local_b0 + 1;
        } while (local_b0 <
                 (ulong)(((long)(pPVar4->types).
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pPVar4->types).
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x5555555555555555));
      }
    }
    iVar5._M_current = local_c8._M_current;
    if (local_d0 != local_c8._M_current) {
      local_b8 = (vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                  *)&(this->payload_columns).col_types;
      __args = local_d0;
      do {
        pvVar13 = vector<duckdb::LogicalType,_true>::operator[](&pPVar4->types,*__args);
        p_Var7 = (_func_int *)*__args;
        pp_Var8 = ((_func_int ***)local_80._0_8_)[(ulong)p_Var7 % (ulong)local_80._8_8_];
        pp_Var14 = (_func_int **)0x0;
        if ((pp_Var8 != (_func_int **)0x0) &&
           (pp_Var14 = pp_Var8, pp_Var18 = (_func_int **)*pp_Var8,
           p_Var7 != *(_func_int **)((long)*pp_Var8 + 8))) {
          while (pp_Var8 = (_func_int **)*pp_Var18, pp_Var8 != (_func_int **)0x0) {
            pp_Var14 = (_func_int **)0x0;
            if (((ulong)pp_Var8[1] % (ulong)local_80._8_8_ != (ulong)p_Var7 % (ulong)local_80._8_8_)
               || (pp_Var14 = pp_Var18, pp_Var18 = pp_Var8, p_Var7 == pp_Var8[1]))
            goto LAB_00bd50e8;
          }
          pp_Var14 = (_func_int **)0x0;
        }
LAB_00bd50e8:
        if (pp_Var14 == (_func_int **)0x0) {
          p_Var16 = (_func_int *)0x0;
        }
        else {
          p_Var16 = *pp_Var14;
        }
        if (p_Var16 == (_func_int *)0x0) {
          iVar17._M_current =
               (this->payload_columns).col_idxs.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar17._M_current ==
              (this->payload_columns).col_idxs.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>(local_90,iVar17,__args);
          }
          else {
            *iVar17._M_current = (unsigned_long)p_Var7;
            (this->payload_columns).col_idxs.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar17._M_current + 1;
          }
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_b8,
                     pvVar13);
          uVar15 = (((long)(this->condition_types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->condition_types).
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                   ((long)(this->payload_columns).col_types.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->payload_columns).col_types.
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) - 1
          ;
          iVar17._M_current =
               (this->rhs_output_columns).col_idxs.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_b0 = uVar15;
          if (iVar17._M_current !=
              (this->rhs_output_columns).col_idxs.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_00bd51ac;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,iVar17,
                     &local_b0);
        }
        else {
          iVar17._M_current =
               (this->rhs_output_columns).col_idxs.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar17._M_current ==
              (this->rhs_output_columns).col_idxs.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      (local_a0,iVar17,(unsigned_long *)(p_Var16 + 0x10));
          }
          else {
            uVar15 = *(unsigned_long *)(p_Var16 + 0x10);
LAB_00bd51ac:
            *iVar17._M_current = uVar15;
            (this->rhs_output_columns).col_idxs.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar17._M_current + 1;
          }
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&(this->rhs_output_columns).col_types.
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,pvVar13)
        ;
        __args = __args + 1;
      } while (__args != iVar5._M_current);
    }
    if (local_d0 != (unsigned_long *)0x0) {
      operator_delete(local_d0);
    }
  }
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_80);
  return;
}

Assistant:

PhysicalHashJoin::PhysicalHashJoin(LogicalOperator &op, PhysicalOperator &left, PhysicalOperator &right,
                                   vector<JoinCondition> cond, JoinType join_type,
                                   const vector<idx_t> &left_projection_map, const vector<idx_t> &right_projection_map,
                                   vector<LogicalType> delim_types, idx_t estimated_cardinality,
                                   unique_ptr<JoinFilterPushdownInfo> pushdown_info_p)
    : PhysicalComparisonJoin(op, PhysicalOperatorType::HASH_JOIN, std::move(cond), join_type, estimated_cardinality),
      delim_types(std::move(delim_types)) {

	filter_pushdown = std::move(pushdown_info_p);

	children.push_back(left);
	children.push_back(right);

	// Collect condition types, and which conditions are just references (so we won't duplicate them in the payload)
	unordered_map<idx_t, idx_t> build_columns_in_conditions;
	for (idx_t cond_idx = 0; cond_idx < conditions.size(); cond_idx++) {
		auto &condition = conditions[cond_idx];
		condition_types.push_back(condition.left->return_type);
		if (condition.right->GetExpressionClass() == ExpressionClass::BOUND_REF) {
			build_columns_in_conditions.emplace(condition.right->Cast<BoundReferenceExpression>().index, cond_idx);
		}
	}

	auto &lhs_input_types = children[0].get().GetTypes();

	// Create a projection map for the LHS (if it was empty), for convenience
	lhs_output_columns.col_idxs = left_projection_map;
	if (lhs_output_columns.col_idxs.empty()) {
		lhs_output_columns.col_idxs.reserve(lhs_input_types.size());
		for (idx_t i = 0; i < lhs_input_types.size(); i++) {
			lhs_output_columns.col_idxs.emplace_back(i);
		}
	}

	for (auto &lhs_col : lhs_output_columns.col_idxs) {
		auto &lhs_col_type = lhs_input_types[lhs_col];
		lhs_output_columns.col_types.push_back(lhs_col_type);
	}

	// For ANTI, SEMI and MARK join, we only need to store the keys, so for these the payload/RHS types are empty
	if (join_type == JoinType::ANTI || join_type == JoinType::SEMI || join_type == JoinType::MARK) {
		return;
	}

	auto &rhs_input_types = children[1].get().GetTypes();

	// Create a projection map for the RHS (if it was empty), for convenience
	auto right_projection_map_copy = right_projection_map;
	if (right_projection_map_copy.empty()) {
		right_projection_map_copy.reserve(rhs_input_types.size());
		for (idx_t i = 0; i < rhs_input_types.size(); i++) {
			right_projection_map_copy.emplace_back(i);
		}
	}

	// Now fill payload expressions/types and RHS columns/types
	for (auto &rhs_col : right_projection_map_copy) {
		auto &rhs_col_type = rhs_input_types[rhs_col];

		auto it = build_columns_in_conditions.find(rhs_col);
		if (it == build_columns_in_conditions.end()) {
			// This rhs column is not a join key
			payload_columns.col_idxs.push_back(rhs_col);
			payload_columns.col_types.push_back(rhs_col_type);
			rhs_output_columns.col_idxs.push_back(condition_types.size() + payload_columns.col_types.size() - 1);
		} else {
			// This rhs column is a join key
			rhs_output_columns.col_idxs.push_back(it->second);
		}
		rhs_output_columns.col_types.push_back(rhs_col_type);
	}
}